

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BHeap.h
# Opt level: O1

void __thiscall
ADS::BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator>::bubbleUp
          (BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator> *this,
          BNode<ADS::NodeDistancePairClass_*> *pNode)

{
  uint uVar1;
  uint uVar2;
  BNode<ADS::NodeDistancePairClass_*> *pNode2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  
  pNode2 = pNode->pParent;
  bVar5 = pNode2 == (BNode<ADS::NodeDistancePairClass_*> *)0x0;
  bVar6 = bVar5;
  do {
    if (bVar6) {
LAB_00104396:
      if (pNode != (BNode<ADS::NodeDistancePairClass_*> *)0x0) {
        if (this->_pHead != (BNode<ADS::NodeDistancePairClass_*> *)0x0) {
          uVar2 = (((pNode->super_Node<ADS::NodeDistancePairClass_*>).el)->
                  super_NodeDistancePair<unsigned_int,_unsigned_int>)._cost;
          uVar1 = (((this->_pHead->super_Node<ADS::NodeDistancePairClass_*>).el)->
                  super_NodeDistancePair<unsigned_int,_unsigned_int>)._cost;
          bVar6 = uVar2 >= uVar1 && uVar2 != uVar1;
          if (this->_bIsMinHeap != false) {
            bVar6 = uVar2 < uVar1;
          }
          if (!bVar6) {
            return;
          }
        }
        this->_pHead = pNode;
      }
      return;
    }
    bVar3 = bVar5;
    if (pNode == (BNode<ADS::NodeDistancePairClass_*> *)0x0) {
LAB_00104392:
      if (!bVar3) {
        return;
      }
      goto LAB_00104396;
    }
    uVar1 = (((pNode2->super_Node<ADS::NodeDistancePairClass_*>).el)->
            super_NodeDistancePair<unsigned_int,_unsigned_int>)._cost;
    if (this->_bIsMinHeap == true) {
      bVar4 = (((pNode->super_Node<ADS::NodeDistancePairClass_*>).el)->
              super_NodeDistancePair<unsigned_int,_unsigned_int>)._cost < uVar1;
    }
    else {
      bVar4 = uVar1 < (((pNode->super_Node<ADS::NodeDistancePairClass_*>).el)->
                      super_NodeDistancePair<unsigned_int,_unsigned_int>)._cost;
    }
    bVar3 = bVar6;
    if (!bVar4) goto LAB_00104392;
    swap(this,pNode,pNode2);
    pNode2 = pNode->pParent;
    bVar6 = pNode2 == (BNode<ADS::NodeDistancePairClass_*> *)0x0;
  } while( true );
}

Assistant:

void BHeap<T, Comparator>::bubbleUp (BNode<T> *pNode)
    {
        while (pNode->pParent != NULL) {
            if (isHead (pNode, pNode->pParent))
                swap (pNode, pNode->pParent);
            else
                break;
        }

        if (pNode->pParent == NULL)
            /* it made it to the root - it may be the new head */
            if (isHead (pNode, _pHead))
                _pHead = pNode;
    }